

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

void __thiscall mir::inst::PhiInst::display(PhiInst *this,ostream *o)

{
  ostream *poVar1;
  size_type sVar2;
  ostream *in_RSI;
  long in_RDI;
  size_t i;
  Displayable *in_stack_ffffffffffffffc8;
  ostream *in_stack_ffffffffffffffd0;
  ulong local_18;
  
  poVar1 = prelude::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::operator<<(poVar1," = phi [");
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::size
                      ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                       (in_RDI + 0x28));
    if (sVar2 <= local_18) break;
    if (local_18 != 0) {
      std::operator<<(in_RSI,", ");
    }
    poVar1 = in_RSI;
    std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::operator[]
              ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)(in_RDI + 0x28),
               local_18);
    prelude::operator<<(poVar1,in_stack_ffffffffffffffc8);
    local_18 = local_18 + 1;
  }
  std::operator<<(in_RSI,"]");
  return;
}

Assistant:

void PhiInst::display(std::ostream& o) const {
  o << dest << " = phi [";
  for (size_t i = 0; i < vars.size(); i++) {
    if (i != 0) o << ", ";
    o << vars[i];
  }
  o << "]";
}